

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surjection_impl.h
# Opt level: O0

void secp256k1_surjection_genmessage
               (uchar *msg32,secp256k1_generator *ephemeral_input_tags,size_t n_input_tags,
               secp256k1_generator *ephemeral_output_tag)

{
  secp256k1_generator *psVar1;
  undefined1 local_c8 [8];
  secp256k1_sha256 sha256_en;
  size_t pk_len;
  uchar pk_ser [33];
  size_t i;
  secp256k1_generator *ephemeral_output_tag_local;
  size_t n_input_tags_local;
  secp256k1_generator *ephemeral_input_tags_local;
  uchar *msg32_local;
  
  sha256_en.bytes = 0x21;
  secp256k1_sha256_initialize((secp256k1_sha256 *)local_c8);
  for (stack0xffffffffffffffd0 = 0; stack0xffffffffffffffd0 < n_input_tags;
      register0x00000000 = stack0xffffffffffffffd0 + 1) {
    pk_len._0_1_ = (ephemeral_input_tags[stack0xffffffffffffffd0].data[0x3f] & 1) + 2;
    psVar1 = ephemeral_input_tags + stack0xffffffffffffffd0;
    unique0x00012000 = *(undefined8 *)psVar1->data;
    pk_ser._1_8_ = *(undefined8 *)(psVar1->data + 8);
    pk_ser._9_8_ = *(undefined8 *)(psVar1->data + 0x10);
    pk_ser._17_8_ = *(undefined8 *)(psVar1->data + 0x18);
    secp256k1_sha256_write((secp256k1_sha256 *)local_c8,(uchar *)&pk_len,sha256_en.bytes);
  }
  pk_len._0_1_ = (ephemeral_output_tag->data[0x3f] & 1) + 2;
  unique0x00012000 = *(undefined8 *)ephemeral_output_tag->data;
  pk_ser._1_8_ = *(undefined8 *)(ephemeral_output_tag->data + 8);
  pk_ser._9_8_ = *(undefined8 *)(ephemeral_output_tag->data + 0x10);
  pk_ser._17_8_ = *(undefined8 *)(ephemeral_output_tag->data + 0x18);
  secp256k1_sha256_write((secp256k1_sha256 *)local_c8,(uchar *)&pk_len,sha256_en.bytes);
  secp256k1_sha256_finalize((secp256k1_sha256 *)local_c8,msg32);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_surjection_genmessage(unsigned char *msg32, const secp256k1_generator *ephemeral_input_tags, size_t n_input_tags, const secp256k1_generator *ephemeral_output_tag) {
    /* compute message */
    size_t i;
    unsigned char pk_ser[33];
    size_t pk_len = sizeof(pk_ser);
    secp256k1_sha256 sha256_en;

    secp256k1_sha256_initialize(&sha256_en);
    for (i = 0; i < n_input_tags; i++) {
        pk_ser[0] = 2 + (ephemeral_input_tags[i].data[63] & 1);
        memcpy(&pk_ser[1], &ephemeral_input_tags[i].data[0], 32);
        secp256k1_sha256_write(&sha256_en, pk_ser, pk_len);
    }
    pk_ser[0] = 2 + (ephemeral_output_tag->data[63] & 1);
    memcpy(&pk_ser[1], &ephemeral_output_tag->data[0], 32);
    secp256k1_sha256_write(&sha256_en, pk_ser, pk_len);
    secp256k1_sha256_finalize(&sha256_en, msg32);
}